

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_1,_2,_1,_1,_2> *dst,
               Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *src,
               assign_op<double,_double> *func)

{
  ActualDstType actualDst;
  assign_op<double,_double> *func_local;
  Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *src_local;
  Matrix<double,_1,_2,_1,_1,_2> *dst_local;
  
  Assignment<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);
  
  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);
  
  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}